

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall
cmState::AddBuiltinCommand
          (cmState *this,string *name,
          unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *command)

{
  pointer *__ptr;
  cmLegacyCommandWrapper local_48;
  _Head_base<0UL,_cmCommand_*,_false> local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_40._M_head_impl =
       (command->_M_t).super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
       super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
       super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl;
  (command->_M_t).super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl = (cmCommand *)0x0;
  cmLegacyCommandWrapper::cmLegacyCommandWrapper
            (&local_48,(unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)&local_40);
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(8);
  ((__uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_> *)local_38._M_unused._0_8_)->_M_t =
       (tuple<cmCommand_*,_std::default_delete<cmCommand>_>)
       local_48.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
       super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
       super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl;
  local_48.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       (unique_ptr<cmCommand,_std::default_delete<cmCommand>_>)
       (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0;
  pcStack_20 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_cmLegacyCommandWrapper>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_cmLegacyCommandWrapper>
             ::_M_manager;
  AddBuiltinCommand(this,name,(Command *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
      super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl !=
      (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0) {
    (**(code **)(*(long *)local_48.Command._M_t.
                          super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
                          super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                          super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl + 8))();
  }
  local_48.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       (unique_ptr<cmCommand,_std::default_delete<cmCommand>_>)
       (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0;
  if (local_40._M_head_impl != (cmCommand *)0x0) {
    (*(local_40._M_head_impl)->_vptr_cmCommand[1])();
  }
  return;
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name,
                                std::unique_ptr<cmCommand> command)
{
  this->AddBuiltinCommand(name, cmLegacyCommandWrapper(std::move(command)));
}